

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_extend_rom.hpp
# Opt level: O2

void PatchExtendROM::add_bankswitching_when_copying_save(ROM *rom)

{
  uint32_t address;
  Code *pCVar1;
  allocator<char> local_149;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined2 local_130;
  undefined1 local_12e;
  undefined1 local_128 [24];
  undefined3 uStack_110;
  undefined5 uStack_10d;
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_e0;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._0_8_ = &PTR_getXn_00246ce8;
  local_128._8_8_ = (pointer)0x200a130f1;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::moveb(&func,'\x01',(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"loop",(allocator<char> *)local_148);
  md::Code::label(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = 1;
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20000;
  local_148._0_8_ = &PTR_getXn_00246d28;
  local_138 = 0;
  local_148._8_8_ = &PTR_getXn_00246c60;
  local_130 = 0;
  local_12e = 2;
  md::Code::moveb(&func,(Param *)local_128,(Param *)local_148);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246c60;
  md::Code::addqw(&func,'\x02',(Register *)local_128);
  local_128[8] = 1;
  local_128._0_8_ = &PTR_getXn_00246c60;
  md::Code::addqw(&func,'\x02',(Register *)local_128);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00246bf0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"loop",&local_149);
  md::Code::dbra(&func,(DataRegister *)local_148,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._0_8_ = &PTR_getXn_00246ce8;
  local_128._8_8_ = (pointer)0x200a130f1;
  md::Code::moveb(&func,'\0',(Param *)local_128);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"",(allocator<char> *)local_148);
  address = md::ROM::inject_code(rom,&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_108._M_left = &local_108;
  _Stack_e0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8 = 0;
  _Stack_e0._0_8_ = 0;
  local_108._M_color = _S_red;
  local_108._4_4_ = 0;
  local_108._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _uStack_110 = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0.super__Rb_tree_header._M_header._M_left = &_Stack_e0.super__Rb_tree_header._M_header;
  _Stack_e0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0.super__Rb_tree_header._M_node_count = 0;
  local_108._M_right = local_108._M_left;
  _Stack_e0.super__Rb_tree_header._M_header._M_right =
       _Stack_e0.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jsr((Code *)local_128,address);
  pCVar1 = md::Code::nop(pCVar1,2);
  md::ROM::set_code(rom,0x15f8,pCVar1);
  md::Code::~Code((Code *)local_128);
  md::Code::~Code(&func);
  return;
}

Assistant:

static void add_bankswitching_when_writing_save_checksum(md::ROM& rom)
    {
        md::Code proc;
        proc.moveb(BANK_SRAM, addr_(0xA130F1)); // switch to SRAM
        proc.moveb(reg_D1, addr_(reg_A0));
        proc.moveb(BANK_ROM, addr_(0xA130F1)); // switch to ROM
        proc.movem_from_stack({ reg_D0, reg_D1, reg_D7 }, { reg_A0, reg_A1, reg_A2 });
        proc.rts();

        uint32_t proc_write_checksum = rom.inject_code(proc);

        rom.set_code(0x15BA, md::Code().jmp(proc_write_checksum));
    }